

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.h
# Opt level: O1

O3DGCErrorCode __thiscall o3dgc::TriangleFans::AddTFAN(TriangleFans *this)

{
  ulong uVar1;
  long *__src;
  long lVar2;
  long *__dest;
  long lVar3;
  ulong uVar4;
  
  if (-1 < this->m_numTFANs) {
    uVar4 = this->m_numTFANs + 1;
    this->m_numTFANs = uVar4;
    uVar1 = this->m_sizeTFANAllocatedSize;
    if (uVar4 == uVar1) {
      this->m_sizeTFANAllocatedSize = uVar1 * 2;
      __src = this->m_sizeTFAN;
      __dest = (long *)operator_new__(-(ulong)(uVar1 >> 0x3c != 0) | uVar1 << 4);
      this->m_sizeTFAN = __dest;
      memcpy(__dest,__src,uVar4 * 8);
      if (__src != (long *)0x0) {
        operator_delete__(__src);
      }
    }
    lVar2 = this->m_numTFANs;
    if (lVar2 < 2) {
      lVar3 = 0;
    }
    else {
      lVar3 = this->m_sizeTFAN[lVar2 + -2];
    }
    this->m_sizeTFAN[lVar2 + -1] = lVar3;
    return O3DGC_OK;
  }
  __assert_fail("m_numTFANs >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                ,0xec,"O3DGCErrorCode o3dgc::TriangleFans::AddTFAN()");
}

Assistant:

O3DGCErrorCode                AddTFAN()
                                    {
                                        assert(m_numTFANs >= 0);
                                        ++m_numTFANs;
                                        if (m_numTFANs == m_sizeTFANAllocatedSize)
                                        {
                                            m_sizeTFANAllocatedSize *= 2;
                                            long * tmp = m_sizeTFAN;
                                            m_sizeTFAN = new long [m_sizeTFANAllocatedSize];
                                            memcpy(m_sizeTFAN, tmp, sizeof(long) * m_numTFANs);
                                            delete [] tmp;
                                        }
                                        m_sizeTFAN[m_numTFANs-1] = (m_numTFANs > 1) ? m_sizeTFAN[m_numTFANs-2] : 0;
                                        return O3DGC_OK;
                                    }